

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

int lys_set_implemented(lys_module *module)

{
  lys_module **pplVar1;
  lys_module *plVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  LYS_NODE LVar6;
  LY_ERR *pLVar7;
  lys_include *plVar8;
  lys_node *plVar9;
  lys_node *plVar10;
  char *pcVar11;
  lys_submodule *plVar12;
  char *format;
  unres_schema *puVar13;
  lys_node *snode;
  long lVar14;
  lys_node *plVar15;
  long lVar16;
  ulong uVar17;
  unres_schema *local_50;
  unres_schema *unres;
  unres_schema *local_40;
  byte local_31;
  
  if (module == (lys_module *)0x0) {
    pLVar7 = ly_errno_location();
    *pLVar7 = LY_EINVAL;
LAB_001599db:
    iVar5 = 1;
  }
  else {
    bVar4 = module->field_0x40;
    if ((bVar4 & 1) != 0) {
      module = (lys_module *)module->data;
      bVar4 = module->field_0x40;
    }
    bVar3 = bVar4;
    if ((bVar4 & 0x40) != 0) {
      lys_set_enabled(module);
      bVar3 = module->field_0x40;
    }
    iVar5 = 0;
    if (-1 < (char)bVar3) {
      unres = (unres_schema *)CONCAT71(unres._1_7_,bVar3);
      lVar16 = (long)(module->ctx->models).used;
      local_31 = bVar4;
      if (0 < lVar16) {
        pplVar1 = (module->ctx->models).list;
        lVar14 = 0;
        do {
          plVar2 = pplVar1[lVar14];
          if (((module != plVar2) && (iVar5 = strcmp(module->name,plVar2->name), iVar5 == 0)) &&
             ((char)plVar2->field_0x40 < '\0')) {
            pLVar7 = ly_errno_location();
            *pLVar7 = LY_EINVAL;
            pcVar11 = module->name;
            format = "Module \"%s\" in another revision already implemented.";
            goto LAB_00159a09;
          }
          lVar14 = lVar14 + 1;
        } while (lVar16 != lVar14);
      }
      local_50 = (unres_schema *)calloc(1,0x28);
      local_40 = local_50;
      if (local_50 != (unres_schema *)0x0) {
        module->field_0x40 = (byte)unres | 0x80;
        bVar4 = module->augment_size;
        if (bVar4 != 0) {
          lVar16 = 0;
          uVar17 = 0;
          do {
            if (*(long *)(module->augment->padding + lVar16 + 0x3c) == 0) {
              iVar5 = unres_schema_add_node
                                (module,local_40,module->augment->padding + lVar16 + -0x1c,
                                 UNRES_AUGMENT,(lys_node *)0x0);
              if (iVar5 == -1) goto LAB_001599bd;
              bVar4 = module->augment_size;
            }
            uVar17 = uVar17 + 1;
            lVar16 = lVar16 + 0x68;
          } while (uVar17 < bVar4);
        }
        plVar15 = module->data;
LAB_001597a2:
        plVar9 = plVar15;
        if (plVar15 != (lys_node *)0x0) {
          do {
            do {
              snode = plVar9;
              LVar6 = snode->nodetype;
              if (LVar6 == LYS_GROUPING) break;
              if (((LVar6 & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
                 (iVar5._0_2_ = snode[1].flags, iVar5._2_1_ = snode[1].ext_size,
                 iVar5._3_1_ = snode[1].iffeature_size, iVar5 == 9)) {
                iVar5 = unres_schema_add_node
                                  (module,local_40,&snode[1].ref,UNRES_TYPE_LEAFREF,snode);
                if (iVar5 != -1) {
                  LVar6 = snode->nodetype;
                  goto LAB_001597f1;
                }
                goto LAB_001599bd;
              }
LAB_001597f1:
              plVar9 = snode->child;
            } while (snode->child != (lys_node *)0x0 &&
                     (LVar6 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN);
            if (snode == plVar15) goto LAB_001598dd;
            plVar9 = snode->next;
            if (snode->next == (lys_node *)0x0) {
              do {
                if (snode->nodetype == LYS_EXT) {
                  if (snode->padding[1] != '\x01') goto LAB_00159879;
                  snode = (lys_node *)snode->dsc;
LAB_00159846:
                  LVar6 = snode->nodetype;
                  if (LVar6 == LYS_AUGMENT) {
                    snode = snode->prev;
                    if (snode == (lys_node *)0x0) goto LAB_00159879;
                    LVar6 = snode->nodetype;
                  }
                  if (LVar6 == LYS_EXT) {
                    if (snode->padding[1] == '\x01') {
                      plVar9 = (lys_node *)snode->dsc;
                      goto LAB_001598ce;
                    }
                    goto LAB_0015987c;
                  }
                  plVar9 = snode->parent;
                  if (plVar9 == (lys_node *)0x0) goto LAB_0015987c;
LAB_001598ce:
                  if (plVar9->nodetype == LYS_AUGMENT) {
                    plVar9 = plVar9->prev;
                  }
                }
                else {
                  snode = snode->parent;
                  if (snode != (lys_node *)0x0) goto LAB_00159846;
LAB_00159879:
                  snode = (lys_node *)0x0;
LAB_0015987c:
                  plVar9 = (lys_node *)0x0;
                }
                if (plVar15->nodetype == LYS_EXT) {
                  if (plVar15->padding[1] == '\x01') {
                    plVar10 = (lys_node *)plVar15->dsc;
                    goto LAB_0015989b;
                  }
LAB_001598aa:
                  plVar10 = (lys_node *)0x0;
                }
                else {
                  plVar10 = plVar15->parent;
                  if (plVar10 == (lys_node *)0x0) goto LAB_001598aa;
LAB_0015989b:
                  if (plVar10->nodetype == LYS_AUGMENT) {
                    plVar10 = plVar10->prev;
                  }
                }
                if (plVar9 == plVar10) goto LAB_001598dd;
                plVar9 = snode->next;
              } while (snode->next == (lys_node *)0x0);
            }
          } while( true );
        }
        bVar4 = module->inc_size;
        if (bVar4 == 0) goto LAB_001599a3;
        plVar8 = module->inc;
        puVar13 = (unres_schema *)0x0;
        while (plVar12 = plVar8[(long)puVar13].submodule, plVar12 != (lys_submodule *)0x0) {
          if (plVar12->augment_size != '\0') {
            lVar16 = 0;
            lVar14 = 0;
            uVar17 = 0;
            unres = puVar13;
            do {
              if (*(long *)(plVar12->augment->padding + lVar16 + 0x3c) == 0) {
                iVar5 = unres_schema_add_node
                                  (*(lys_module **)(plVar8->rev + lVar14 + -8),local_40,
                                   plVar12->augment->padding + lVar16 + -0x1c,UNRES_AUGMENT,
                                   (lys_node *)0x0);
                if (iVar5 == -1) goto LAB_001599bd;
                plVar8 = module->inc;
              }
              uVar17 = uVar17 + 1;
              plVar12 = plVar8[(long)puVar13].submodule;
              lVar14 = lVar14 + 0x30;
              lVar16 = lVar16 + 0x68;
            } while (uVar17 < plVar12->augment_size);
            bVar4 = module->inc_size;
            puVar13 = unres;
          }
          puVar13 = (unres_schema *)((long)&puVar13->item + 1);
          if ((unres_schema *)(ulong)bVar4 <= puVar13) break;
        }
LAB_001599a3:
        if ((local_40->count == 0) || (iVar5 = resolve_unres_schema(module,local_40), iVar5 == 0)) {
          unres_schema_free(module,&local_50);
          return 0;
        }
LAB_001599bd:
        if ((local_31 & 0x40) != 0) {
          lys_set_disabled(module);
        }
        module->field_0x40 = module->field_0x40 & 0x7f;
        unres_schema_free(module,&local_50);
        goto LAB_001599db;
      }
      pLVar7 = ly_errno_location();
      *pLVar7 = LY_EMEM;
      format = "Memory allocation failed (%s()).";
      pcVar11 = "lys_set_implemented";
LAB_00159a09:
      ly_log(LY_LLERR,format,pcVar11);
      iVar5 = 1;
      if ((local_31 & 0x40) != 0) {
        lys_set_disabled(module);
      }
    }
  }
  return iVar5;
LAB_001598dd:
  plVar15 = plVar15->next;
  goto LAB_001597a2;
}

Assistant:

API int
lys_set_implemented(const struct lys_module *module)
{
    struct ly_ctx *ctx;
    struct unres_schema *unres;
    int i, j, disabled = 0;

    if (!module) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    module = lys_main_module(module);

    if (module->disabled) {
        disabled = 1;
        lys_set_enabled(module);
    }

    if (module->implemented) {
        return EXIT_SUCCESS;
    }

    ctx = module->ctx;

    for (i = 0; i < ctx->models.used; ++i) {
        if (module == ctx->models.list[i]) {
            continue;
        }

        if (!strcmp(module->name, ctx->models.list[i]->name) && ctx->models.list[i]->implemented) {
            LOGERR(LY_EINVAL, "Module \"%s\" in another revision already implemented.", module->name);
            if (disabled) {
                /* set it back disabled */
                lys_set_disabled(module);
            }
            return EXIT_FAILURE;
        }
    }

    unres = calloc(1, sizeof *unres);
    if (!unres) {
        LOGMEM;
        if (disabled) {
            /* set it back disabled */
            lys_set_disabled(module);
        }
        return EXIT_FAILURE;
    }
    /* recursively make the module implemented */
    ((struct lys_module *)module)->implemented = 1;
    if (lys_set_implemented_recursion((struct lys_module *)module, unres)) {
        goto error;
    }
    /* process augments in submodules */
    for (i = 0; i < module->inc_size && module->inc[i].submodule; ++i) {
        for (j = 0; j < module->inc[i].submodule->augment_size; j++) {
            /* apply augment */
            if (!module->inc[i].submodule->augment[j].target
                    && (unres_schema_add_node((struct lys_module *)module->inc[j].submodule, unres,
                                              &module->inc[i].submodule->augment[j], UNRES_AUGMENT, NULL) == -1)) {

                goto error;
            }
        }
    }
    /* try again resolve augments in other modules possibly augmenting this one,
     * since we have just enabled it
     */
    /* resolve rest of unres items */
    if (unres->count && resolve_unres_schema((struct lys_module *)module, unres)) {
        goto error;
    }
    unres_schema_free((struct lys_module *)module, &unres);

    return EXIT_SUCCESS;

error:

    if (disabled) {
        /* set it back disabled */
        lys_set_disabled(module);
    }

    ((struct lys_module *)module)->implemented = 0;
    unres_schema_free((struct lys_module *)module, &unres);
    return EXIT_FAILURE;
}